

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O3

void __thiscall
cmCTestMultiProcessHandler::UnlockResources(cmCTestMultiProcessHandler *this,int index)

{
  _Rb_tree_header *p_Var1;
  mapped_type pcVar2;
  pointer puVar3;
  ulong uVar4;
  PropertiesMap *this_00;
  mapped_type *ppcVar5;
  _Base_ptr p_Var6;
  ulong uVar7;
  pointer puVar8;
  size_t sVar9;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar10;
  unsigned_long p;
  unsigned_long local_48;
  int local_3c;
  PropertiesMap *local_38;
  
  local_38 = &this->Properties;
  local_3c = index;
  ppcVar5 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&local_38->
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&local_3c);
  pcVar2 = *ppcVar5;
  puVar8 = (pcVar2->Affinity).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar3 = (pcVar2->Affinity).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar8 != puVar3) {
    do {
      local_48 = *puVar8;
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)&this->ProcessorsAvailable,&local_48);
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar3);
    puVar8 = (pcVar2->Affinity).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((pcVar2->Affinity).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_finish != puVar8) {
      (pcVar2->Affinity).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar8;
    }
  }
  p_Var6 = (pcVar2->ProjectResources)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(pcVar2->ProjectResources)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    do {
      pVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::equal_range(&(this->ProjectResourcesLocked)._M_t,(key_type *)(p_Var6 + 1));
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_aux(&(this->ProjectResourcesLocked)._M_t,(_Base_ptr)pVar10.first._M_node,
                     (_Base_ptr)pVar10.second._M_node);
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  this_00 = local_38;
  if (pcVar2->RunSerial != false) {
    this->SerialTestRunning = false;
  }
  local_48 = CONCAT44(local_48._4_4_,local_3c);
  ppcVar5 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&local_38->
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,(key_type *)&local_48);
  if ((this->ParallelLevel).super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged == true) {
    uVar4 = (this->ParallelLevel).super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_payload._M_value;
    uVar7 = 0x10000;
    if (uVar4 != 0) {
      uVar7 = uVar4;
    }
  }
  else {
    uVar7 = 0x10000;
    if ((this->JobServerClient).super__Optional_base<cmUVJobServerClient,_false,_false>._M_payload.
        super__Optional_payload<cmUVJobServerClient,_true,_false,_false>.
        super__Optional_payload_base<cmUVJobServerClient>._M_engaged == false) {
      uVar7 = this->ParallelLevelDefault;
    }
  }
  sVar9 = (long)(*ppcVar5)->Processors;
  if (uVar7 < (ulong)(long)(*ppcVar5)->Processors) {
    sVar9 = uVar7;
  }
  if (((this->HaveAffinity != 0) && (this->HaveAffinity < sVar9)) &&
     (ppcVar5 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&this_00->
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,(key_type *)&local_48), (*ppcVar5)->WantAffinity != false)) {
    sVar9 = this->HaveAffinity;
  }
  this->RunningCount = this->RunningCount - sVar9;
  return;
}

Assistant:

void cmCTestMultiProcessHandler::UnlockResources(int index)
{
  auto* properties = this->Properties[index];

  for (auto p : properties->Affinity) {
    this->ProcessorsAvailable.insert(p);
  }
  properties->Affinity.clear();

  for (std::string const& i : properties->ProjectResources) {
    this->ProjectResourcesLocked.erase(i);
  }

  if (properties->RunSerial) {
    this->SerialTestRunning = false;
  }

  this->RunningCount -= this->GetProcessorsUsed(index);
}